

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::UaddCarryCase::compare(UaddCarryCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  uint uVar2;
  pointer pSVar3;
  long lVar4;
  int iVar5;
  ostream *poVar6;
  uint uVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ostringstream *this_00;
  long lVar12;
  Hex<8UL> local_38;
  
  pSVar3 = (this->super_IntegerFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar3->varType).m_data.basic.precision;
  iVar5 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  bVar8 = iVar5 < 1;
  if (0 < iVar5) {
    uVar7 = (2 << ((&DAT_01c96080)[(ulong)PVar1 * 4] - 1 & 0x1f)) - 1;
    uVar10 = **inputs;
    uVar2 = *inputs[1];
    uVar9 = uVar10 + uVar2;
    lVar11 = (ulong)uVar2 + (ulong)uVar10;
    uVar10 = (uint)((ulong)lVar11 >> 0x20);
    lVar12 = 0;
    if (((**outputs ^ uVar9) & uVar7) == 0) {
      lVar12 = 0;
      do {
        uVar10 = (uint)((ulong)lVar11 >> 0x20);
        if (*(uint *)((long)outputs[1] + lVar12 * 4) != uVar10) break;
        bVar8 = iVar5 <= (int)lVar12 + 1;
        if (iVar5 + -1 == (int)lVar12) {
          return bVar8;
        }
        uVar10 = *(uint *)((long)*inputs + (lVar12 + 1) * 4);
        uVar2 = *(uint *)((long)inputs[1] + (lVar12 + 1) * 4);
        uVar9 = uVar10 + uVar2;
        lVar11 = (ulong)uVar2 + (ulong)uVar10;
        uVar10 = (uint)((ulong)lVar11 >> 0x20);
        lVar4 = lVar12 + 1;
        lVar12 = lVar12 + 1;
      } while (((*(uint *)((long)*outputs + lVar4 * 4) ^ uVar9) & uVar7) == 0);
    }
    this_00 = &(this->super_IntegerFunctionCase).m_failMsg;
    std::__ostream_insert<char,std::char_traits<char>>
              (&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
    poVar6 = (ostream *)std::ostream::operator<<(this_00,(int)lVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] = ",4);
    local_38.value = (deUint64)uVar9;
    poVar6 = tcu::Format::Hex<8UL>::toStream(&local_38,poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    local_38.value = (deUint64)uVar10;
    tcu::Format::Hex<8UL>::toStream(&local_38,poVar6);
  }
  return bVar8;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const deUint32			mask0			= getLowBitMask(integerLength);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	in0		= ((const deUint32*)inputs[0])[compNdx];
			const deUint32	in1		= ((const deUint32*)inputs[1])[compNdx];
			const deUint32	out0	= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	out1	= ((const deUint32*)outputs[1])[compNdx];
			const deUint32	ref0	= in0+in1;
			const deUint32	ref1	= (deUint64(in0)+deUint64(in1)) > 0xffffffffu ? 1u : 0u;

			if (((out0&mask0) != (ref0&mask0)) || out1 != ref1)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref0) << ", " << tcu::toHex(ref1);
				return false;
			}
		}

		return true;
	}